

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O0

void absl::AbslStringify<absl::strings_internal::StringifySink>(StringifySink *sink,Hex hex)

{
  string_view v;
  string_view v_00;
  ulong in_RDX;
  StringifySink *in_RDI;
  size_t real_width;
  char *end;
  char buffer [32];
  StringifySink *in_stack_ffffffffffffff90;
  Nonnull<char_*> in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_t local_48;
  StringifySink **local_40;
  StringifySink *local_18 [2];
  undefined8 local_8;
  
  local_40 = local_18;
  local_18[0] = in_RDI;
  local_8 = in_RDX;
  local_48 = numbers_internal::FastHexToBufferZeroPad16
                       ((uint64_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (local_48 < (local_8 & 0xff)) {
    memset(local_40 + -4,(uint)local_8._1_1_,0x10);
    memset((void *)((long)local_40 + (-0x10 - local_48)),(uint)local_8._1_1_,0x10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff98,
               (char *)((long)local_40 - (long)(int)(uint)(byte)local_8),local_8 & 0xff);
    v_00._M_str = in_stack_ffffffffffffffa0;
    v_00._M_len = (size_t)in_stack_ffffffffffffff98;
    strings_internal::StringifySink::Append(in_stack_ffffffffffffff90,v_00);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,(char *)((long)local_40 - local_48),local_48);
    v._M_str = in_stack_ffffffffffffffa0;
    v._M_len = (size_t)in_stack_ffffffffffffff98;
    strings_internal::StringifySink::Append(local_18[0],v);
  }
  return;
}

Assistant:

void AbslStringify(S& sink, Hex hex) {
    static_assert(
        numbers_internal::kFastToBufferSize >= 32,
        "This function only works when output buffer >= 32 bytes long");
    char buffer[numbers_internal::kFastToBufferSize];
    char* const end = &buffer[numbers_internal::kFastToBufferSize];
    auto real_width =
        absl::numbers_internal::FastHexToBufferZeroPad16(hex.value, end - 16);
    if (real_width >= hex.width) {
      sink.Append(absl::string_view(end - real_width, real_width));
    } else {
      // Pad first 16 chars because FastHexToBufferZeroPad16 pads only to 16 and
      // max pad width can be up to 20.
      std::memset(end - 32, hex.fill, 16);
      // Patch up everything else up to the real_width.
      std::memset(end - real_width - 16, hex.fill, 16);
      sink.Append(absl::string_view(end - hex.width, hex.width));
    }
  }